

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
Shell::checkNaN(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,Literal *val,NaNResult nan)

{
  char cVar1;
  ostream *poVar2;
  Type TVar3;
  undefined1 auStack_208 [16];
  stringstream err;
  ostream local_1f0 [376];
  Literal local_78;
  Literal local_60;
  string local_48 [32];
  
  TVar3 = nan.type.id;
  std::__cxx11::stringstream::stringstream((stringstream *)(auStack_208 + 8));
  if (nan.kind == Arithmetic) {
    if ((val->type).id == TVar3.id) {
      cVar1 = wasm::Literal::isArithmeticNaN();
      if (cVar1 != '\0') goto LAB_0014cf2d;
    }
    poVar2 = std::operator<<(local_1f0,"expected arithmetic ");
    poVar2 = (ostream *)wasm::operator<<(poVar2,TVar3);
    poVar2 = std::operator<<(poVar2," NaN, got ");
    wasm::Literal::Literal(&local_60,val);
    wasm::operator<<(poVar2,_auStack_208);
    wasm::Literal::~Literal(&local_60);
    std::__cxx11::stringbuf::str();
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_48);
  }
  else {
    if (nan.kind != Canonical) {
LAB_0014cf2d:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      goto LAB_0014cfa9;
    }
    if ((val->type).id == TVar3.id) {
      cVar1 = wasm::Literal::isCanonicalNaN();
      if (cVar1 != '\0') goto LAB_0014cf2d;
    }
    poVar2 = std::operator<<(local_1f0,"expected canonical ");
    poVar2 = (ostream *)wasm::operator<<(poVar2,TVar3);
    poVar2 = std::operator<<(poVar2," NaN, got ");
    wasm::Literal::Literal(&local_78,val);
    wasm::operator<<(poVar2,_auStack_208);
    wasm::Literal::~Literal(&local_78);
    std::__cxx11::stringbuf::str();
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_48);
  }
  std::__cxx11::string::~string(local_48);
LAB_0014cfa9:
  std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_208 + 8));
  return __return_storage_ptr__;
}

Assistant:

Result<> checkNaN(Literal val, NaNResult nan) {
    std::stringstream err;
    switch (nan.kind) {
      case NaNKind::Canonical:
        if (val.type != nan.type || !val.isCanonicalNaN()) {
          err << "expected canonical " << nan.type << " NaN, got " << val;
          return Err{err.str()};
        }
        break;
      case NaNKind::Arithmetic:
        if (val.type != nan.type || !val.isArithmeticNaN()) {
          err << "expected arithmetic " << nan.type << " NaN, got " << val;
          return Err{err.str()};
        }
        break;
    }
    return Ok{};
  }